

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterative_method.c
# Opt level: O1

void Iterative_method_BiCGSTAB
               (Sparse_matrix *matrix,double *x,double *b,uint max_iter,Precond_type precond,
               double omega_precond,double accuracy,double *buffer)

{
  double *newVector;
  double *vector;
  double *vector_00;
  double *pdVar1;
  double *newVector_00;
  size_t __n;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  double *pdVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  uVar2 = matrix->size;
  uVar10 = (ulong)uVar2;
  uVar4 = uVar2 * 2;
  newVector = buffer + uVar4;
  uVar3 = uVar2 * 3;
  dVar13 = 0.0;
  if (uVar10 != 0) {
    uVar6 = 0;
    do {
      dVar13 = dVar13 + b[uVar6] * b[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar10 != uVar6);
  }
  Sparse_matrix_Apply_to_vector(matrix,x,buffer);
  __n = uVar10 * 8;
  memset(newVector,0,__n);
  memset(buffer + uVar3,0,__n);
  if (uVar10 != 0) {
    lVar7 = 0;
    do {
      dVar11 = *(double *)((long)b + lVar7) - *(double *)((long)buffer + lVar7);
      *(double *)((long)buffer + lVar7) = dVar11;
      *(double *)((long)buffer + lVar7 + uVar10 * 8) = dVar11;
      lVar7 = lVar7 + 8;
    } while (__n - lVar7 != 0);
  }
  if (1 < max_iter) {
    vector = buffer + uVar2 * 4;
    vector_00 = buffer + uVar2 * 5;
    pdVar1 = buffer + uVar2 * 6;
    newVector_00 = buffer + uVar2 * 7;
    uVar5 = 1;
    dVar15 = 1.0;
    dVar12 = 1.0;
    dVar11 = 1.0;
    do {
      dVar14 = 0.0;
      if (uVar10 != 0) {
        sVar8 = 0;
        do {
          dVar14 = dVar14 + *(double *)((long)buffer + sVar8 + uVar10 * 8) *
                            *(double *)((long)buffer + sVar8);
          sVar8 = sVar8 + 8;
        } while (__n != sVar8);
      }
      if (uVar10 != 0) {
        uVar6 = uVar10;
        pdVar9 = buffer;
        do {
          pdVar9[uVar3] =
               (pdVar9[uVar4] * -dVar12 + pdVar9[uVar3]) * ((dVar15 * dVar14) / (dVar11 * dVar12)) +
               *pdVar9;
          pdVar9 = pdVar9 + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      (*precond)(matrix,buffer + uVar3,vector,omega_precond);
      Sparse_matrix_Apply_to_vector(matrix,vector,newVector);
      dVar15 = 0.0;
      if (uVar10 != 0) {
        uVar6 = 0;
        do {
          dVar15 = dVar15 + buffer[uVar10 + uVar6] * newVector[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar10 != uVar6);
      }
      dVar15 = dVar14 / dVar15;
      if (uVar10 != 0) {
        uVar6 = uVar10;
        pdVar9 = buffer;
        do {
          pdVar9[uVar2 * 6] = pdVar9[uVar4] * -dVar15 + *pdVar9;
          pdVar9 = pdVar9 + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      (*precond)(matrix,pdVar1,vector_00,omega_precond);
      Sparse_matrix_Apply_to_vector(matrix,vector_00,newVector_00);
      dVar11 = 0.0;
      dVar12 = 0.0;
      if (uVar10 != 0) {
        uVar6 = 0;
        do {
          dVar12 = dVar12 + newVector_00[uVar6] * pdVar1[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar10 != uVar6);
      }
      if (uVar10 != 0) {
        dVar11 = 0.0;
        uVar6 = 0;
        do {
          dVar11 = dVar11 + newVector_00[uVar6] * newVector_00[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar10 != uVar6);
      }
      dVar12 = dVar12 / dVar11;
      if (uVar10 != 0) {
        uVar6 = 0;
        do {
          x[uVar6] = vector[uVar6] * dVar15 + vector_00[uVar6] * dVar12 + x[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar10 != uVar6);
      }
      dVar11 = 0.0;
      if (uVar10 != 0) {
        uVar6 = 0;
        do {
          dVar11 = dVar11 + buffer[uVar6] * buffer[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar10 != uVar6);
      }
      if (dVar11 < accuracy * accuracy * dVar13) {
        return;
      }
      if (uVar2 != 0) {
        uVar6 = 0;
        do {
          buffer[uVar6] = newVector_00[uVar6] * -dVar12 + pdVar1[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar10 != uVar6);
      }
      uVar5 = uVar5 + 1;
      dVar11 = dVar14;
    } while (uVar5 != max_iter);
  }
  printf("\nWarning: maximum number of iterations reached: %u.\n",(ulong)max_iter);
  return;
}

Assistant:

void Iterative_method_BiCGSTAB (
    Sparse_matrix const * matrix,
    double              * x,
    double const        * b,
    unsigned              max_iter,
    Precond_type          precond,
    double                omega_precond, /* default = 1 */
    double                accuracy,
    double              * buffer /* we need 8 * size */
  ) {

  register unsigned size   = matrix->size;
  register double alpha    = 1;
  register double rho      = 1;
  register double omega    = 1;
  double *r       = buffer;
  double *rcap    = buffer + size;
  double *v       = buffer + size * 2;
  double *p       = buffer + size * 3;
  double *y       = buffer + size * 4;
  double *z       = buffer + size * 5;
  double *s       = buffer + size * 6;
  double *t       = buffer + size * 7;

  register unsigned i, iter;
  register double beta, rhoold;

  register const double bnorm2 = scalar_product(b, b, size);
  register const double accuracy2 = accuracy * accuracy;

  Sparse_matrix_Apply_to_vector (matrix, x, r);
  memset (v, 0, size * sizeof(double));
  memset (p, 0, size * sizeof(double));
  for (i = 0; i < size; ++i) {
    r[i] = b[i] - r[i];
    rcap[i] = r[i];
  }

  for (iter = 1; iter < max_iter; ++iter) {
    rhoold = rho;
    rho = scalar_product (rcap, r, size);
    // beta = (rho / rhoold) * (alpha / omega);
    // should be faster:
    beta = (rho * alpha) / (rhoold * omega);
    for (i = 0; i < size; ++i) {
      p[i] = r[i] + beta * (p[i] - omega * v[i]);
    }
    (*precond)(matrix, p, y, omega_precond);
    Sparse_matrix_Apply_to_vector (matrix, y, v);
    alpha = rho / scalar_product (rcap, v, size);
    for (i = 0; i < size; ++i) {
      s[i] = r[i] - alpha * v[i];
    }
    (*precond)(matrix, s, z, omega_precond);
    Sparse_matrix_Apply_to_vector (matrix, z, t);
    omega = scalar_product (t, s, size) /
            scalar_product (t, t, size);
    for (i = 0; i < size; ++i) {
      x[i] += (alpha * y[i] + omega * z[i]);
    }
    if (scalar_product(r, r, size) < accuracy2 * bnorm2) {
      return;
    }
    for (i = 0; i < size; ++i) {
      r[i] = s[i] - omega * t[i];
    }
  }
  printf ("\nWarning: maximum number of iterations reached: %u.\n", max_iter);
}